

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

void __thiscall helics::TimeCoordinator::localError(TimeCoordinator *this)

{
  function<void_(const_helics::ActionMessage_&)> *this_00;
  pointer pDVar1;
  DependencyInfo *dep;
  pointer pDVar2;
  ActionMessage bye;
  ActionMessage multi;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if ((this->super_BaseTimeCoordinator).disconnected == false) {
    (this->time_granted).internalTimeCode = 0x7fffffffffffffff;
    (this->time_grantBase).internalTimeCode = 0x7fffffffffffffff;
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      if ((this->super_BaseTimeCoordinator).dependencies.dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->super_BaseTimeCoordinator).dependencies.dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      this_00 = &(this->super_BaseTimeCoordinator).sendMessageFunction;
      ActionMessage::ActionMessage(&local_1a0,cmd_local_error);
      local_1a0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(this->super_BaseTimeCoordinator).dependencies.dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 == 0x58) {
        if (((pDVar2->dependency == true) &&
            ((pDVar2->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff)) ||
           (pDVar2->dependent == true)) {
          local_1a0.dest_id.gid = (pDVar2->fedID).gid;
          if (local_1a0.dest_id.gid == local_1a0.source_id.gid) {
            (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(this,&local_1a0);
          }
          else {
            std::function<void_(const_helics::ActionMessage_&)>::operator()(this_00,&local_1a0);
          }
        }
      }
      else {
        ActionMessage::ActionMessage(&local_e8,cmd_multi_message);
        pDVar1 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start; pDVar2 != pDVar1;
            pDVar2 = pDVar2 + 1) {
          if (((pDVar2->dependency == true) &&
              ((pDVar2->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff)) ||
             (pDVar2->dependent == true)) {
            local_1a0.dest_id.gid = (pDVar2->fedID).gid;
            if (local_1a0.dest_id.gid == (this->super_BaseTimeCoordinator).mSourceId.gid) {
              (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(this,&local_1a0);
            }
            else {
              appendMessage(&local_e8,&local_1a0);
            }
          }
        }
        std::function<void_(const_helics::ActionMessage_&)>::operator()(this_00,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
      }
      ActionMessage::~ActionMessage(&local_1a0);
    }
    (this->super_BaseTimeCoordinator).disconnected = true;
  }
  return;
}

Assistant:

void TimeCoordinator::localError()
{
    if (disconnected) {
        return;
    }
    time_granted = Time::maxVal();
    time_grantBase = Time::maxVal();
    if (sendMessageFunction) {
        if (dependencies.empty()) {
            return;
        }
        ActionMessage bye(CMD_LOCAL_ERROR);

        bye.source_id = mSourceId;
        if (dependencies.size() == 1) {
            auto& dep = *dependencies.begin();
            if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                bye.dest_id = dep.fedID;
                if (bye.dest_id == mSourceId) {
                    processTimeMessage(bye);
                } else {
                    sendMessageFunction(bye);
                }
            }

        } else {
            ActionMessage multi(CMD_MULTI_MESSAGE);
            for (const auto& dep : dependencies) {
                if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                    bye.dest_id = dep.fedID;
                    if (dep.fedID == mSourceId) {
                        processTimeMessage(bye);
                    } else {
                        appendMessage(multi, bye);
                    }
                }
            }
            sendMessageFunction(multi);
        }
    }
    disconnected = true;
}